

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O1

void ParseOptionSettings(FScanner *sc)

{
  bool bVar1;
  
  FScanner::MustGetStringName(sc,"{");
  bVar1 = FScanner::CheckString(sc,"}");
  while (!bVar1) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"else");
    if (bVar1) {
      SkipSubBlock(sc);
    }
    else {
      bVar1 = FScanner::Compare(sc,"ifgame");
      if (bVar1) {
        bVar1 = CheckSkipGameBlock(sc);
        if (!bVar1) {
          ParseOptionSettings(sc);
        }
      }
      else {
        bVar1 = FScanner::Compare(sc,"Linespacing");
        if (bVar1) {
          FScanner::MustGetNumber(sc);
          OptionSettings.mLinespacing = sc->Number;
        }
        else {
          bVar1 = FScanner::Compare(sc,"LabelOffset");
          if (bVar1) {
            FScanner::MustGetNumber(sc);
          }
          else {
            FScanner::ScriptError(sc,"Unknown keyword \'%s\'",sc->String);
          }
        }
      }
    }
    bVar1 = FScanner::CheckString(sc,"}");
  }
  return;
}

Assistant:

static void ParseOptionSettings(FScanner &sc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("else"))
		{
			SkipSubBlock(sc);
		}
		else if (sc.Compare("ifgame"))
		{
			if (!CheckSkipGameBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionSettings(sc);
			}
		}
		else if (sc.Compare("Linespacing"))
		{
			sc.MustGetNumber();
			OptionSettings.mLinespacing = sc.Number;
		}
		else if (sc.Compare("LabelOffset"))
		{
			sc.MustGetNumber();
			// ignored
		}
		else
		{
			sc.ScriptError("Unknown keyword '%s'", sc.String);
		}
	}
}